

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void __thiscall IsoWriter::writePrimaryVolumeDescriptor(IsoWriter *this)

{
  uint8_t *buffer;
  int iVar1;
  ulong uVar2;
  uint8_t *puVar3;
  size_t __n;
  uint32_t *buff32;
  allocator<char> local_c9;
  string volumeSetIdentifier;
  string volId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ByteFileWriter local_48;
  
  buffer = this->m_buffer;
  memset(buffer,0,0x800);
  local_48.m_bufferEnd = (uint8_t *)&this->m_currentTime;
  uVar2 = (this->m_file).m_pos;
  iVar1 = this->m_tagLocationBaseAddr;
  this->m_buffer[0] = '\x01';
  this->m_buffer[1] = '\0';
  this->m_buffer[2] = '\x03';
  this->m_buffer[3] = '\0';
  this->m_buffer[6] = '\x01';
  this->m_buffer[7] = '\0';
  *(int *)(this->m_buffer + 0xc) = (int)(uVar2 >> 0xb) - iVar1;
  this->m_buffer[0x10] = '\0';
  this->m_buffer[0x11] = '\0';
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  this->m_buffer[0x14] = '\0';
  this->m_buffer[0x15] = '\0';
  this->m_buffer[0x16] = '\0';
  this->m_buffer[0x17] = '\0';
  local_48.m_curPos = this->m_buffer + 0x18;
  local_48.m_buffer = buffer;
  local_48.m_tagPos = buffer;
  ByteFileWriter::writeDString(&local_48,&this->m_volumeLabel,0x20);
  puVar3 = local_48.m_curPos;
  local_48.m_curPos[0] = '\x01';
  local_48.m_curPos[1] = '\0';
  local_48.m_curPos[2] = '\x01';
  local_48.m_curPos[3] = '\0';
  local_48.m_curPos[4] = '\x02';
  local_48.m_curPos[5] = '\0';
  local_48.m_curPos[6] = '\x02';
  local_48.m_curPos[7] = '\0';
  local_48.m_curPos[8] = '\x01';
  local_48.m_curPos[9] = '\0';
  local_48.m_curPos[10] = '\0';
  local_48.m_curPos[0xb] = '\0';
  local_48.m_curPos[0xc] = '\x01';
  local_48.m_curPos[0xd] = '\0';
  local_48.m_curPos[0xe] = '\0';
  local_48.m_curPos[0xf] = '\0';
  int32uToHex_abi_cxx11_(&volumeSetIdentifier,&this->m_volumeId);
  strToUpperCase(&volId,&volumeSetIdentifier);
  std::__cxx11::string::~string((string *)&volumeSetIdentifier);
  __n = 0x30;
  strPadLeft(&volumeSetIdentifier,&volId,8,'0');
  std::__cxx11::string::operator=((string *)&volId,(string *)&volumeSetIdentifier);
  std::__cxx11::string::~string((string *)&volumeSetIdentifier);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"        ",&local_c9);
  std::operator+(&local_68,&volId,&local_88);
  std::operator+(&volumeSetIdentifier,&local_68,&this->m_volumeLabel);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  anon_unknown.dwarf_cd2a3::writeDString(puVar3 + 0x10,volumeSetIdentifier._M_dataplus._M_p,0x80);
  this->m_buffer[200] = '\0';
  this->m_buffer[0xc9] = 'O';
  this->m_buffer[0xca] = 'S';
  this->m_buffer[0xcb] = 'T';
  this->m_buffer[0xcc] = 'A';
  this->m_buffer[0xcd] = ' ';
  this->m_buffer[0xce] = 'C';
  this->m_buffer[0xcf] = 'o';
  this->m_buffer[0xd0] = 'm';
  this->m_buffer[0xd1] = 'p';
  this->m_buffer[0xd2] = 'r';
  this->m_buffer[0xd3] = 'e';
  this->m_buffer[0xd4] = 's';
  this->m_buffer[0xd5] = 's';
  this->m_buffer[0xd6] = 'e';
  this->m_buffer[0xd7] = 'd';
  this->m_buffer[0xd8] = ' ';
  this->m_buffer[0xd9] = 'U';
  this->m_buffer[0xda] = 'n';
  this->m_buffer[0xdb] = 'i';
  this->m_buffer[0xdc] = 'c';
  this->m_buffer[0xdd] = 'o';
  this->m_buffer[0xde] = 'd';
  this->m_buffer[0xdf] = 'e';
  this->m_buffer[0xe0] = '\0';
  this->m_buffer[0x108] = '\0';
  this->m_buffer[0x109] = 'O';
  this->m_buffer[0x10a] = 'S';
  this->m_buffer[0x10b] = 'T';
  this->m_buffer[0x10c] = 'A';
  this->m_buffer[0x10d] = ' ';
  this->m_buffer[0x10e] = 'C';
  this->m_buffer[0x10f] = 'o';
  this->m_buffer[0x110] = 'm';
  this->m_buffer[0x111] = 'p';
  this->m_buffer[0x112] = 'r';
  this->m_buffer[0x113] = 'e';
  this->m_buffer[0x114] = 's';
  this->m_buffer[0x115] = 's';
  this->m_buffer[0x116] = 'e';
  this->m_buffer[0x117] = 'd';
  this->m_buffer[0x118] = ' ';
  this->m_buffer[0x119] = 'U';
  this->m_buffer[0x11a] = 'n';
  this->m_buffer[0x11b] = 'i';
  this->m_buffer[0x11c] = 'c';
  this->m_buffer[0x11d] = 'o';
  this->m_buffer[0x11e] = 'd';
  this->m_buffer[0x11f] = 'e';
  this->m_buffer[0x120] = '\0';
  this->m_buffer[0x158] = '\0';
  strcpy((char *)(this->m_buffer + 0x159),(this->m_appId)._M_dataplus._M_p);
  anon_unknown.dwarf_cd2a3::writeTimestamp(this->m_buffer + 0x178,this->m_currentTime);
  this->m_buffer[0x184] = '\0';
  strcpy((char *)(this->m_buffer + 0x185),(this->m_impId)._M_dataplus._M_p);
  strcpy((char *)(this->m_buffer + 0x1a4),(this->m_appId)._M_dataplus._M_p);
  this->m_buffer[0x1e8] = '\x01';
  anon_unknown.dwarf_cd2a3::calcDescriptorCRC(buffer,0x200);
  File::write(&this->m_file,(int)buffer,(void *)0x800,__n);
  std::__cxx11::string::~string((string *)&volumeSetIdentifier);
  std::__cxx11::string::~string((string *)&volId);
  return;
}

Assistant:

void IsoWriter::writePrimaryVolumeDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));

    ByteFileWriter writer;
    writer.setBuffer(m_buffer, sizeof(m_buffer));
    writer.writeDescriptorTag(DescriptorTag::PrimVol, absoluteSectorNum());

    writer.writeLE32(0x00);  // Volume Descriptor Sequence Number
    writer.writeLE32(0x00);  // Primary Volume Descriptor Number
    writer.writeDString(m_volumeLabel, 32);

    writer.writeLE16(0x01);  // Volume Sequence Number
    writer.writeLE16(0x01);  // Maximum Volume Sequence Number
    writer.writeLE16(0x02);  // Interchange Level
    writer.writeLE16(0x02);  // Maximum Interchange Level
    writer.writeLE32(0x01);  // Character Set List
    writer.writeLE32(0x01);  // Maximum Character Set List

    std::string volId = strToUpperCase(int32uToHex(m_volumeId));
    volId = strPadLeft(volId, 8, '0');
    const std::string volumeSetIdentifier = volId + std::string("        ") + m_volumeLabel;
    writer.writeDString(volumeSetIdentifier.c_str(), 128);

    // Descriptor Character Set
    m_buffer[200] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 201, "OSTA Compressed Unicode");

    // Explanatory Character Set
    m_buffer[264] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 265, "OSTA Compressed Unicode");

    // skip Volume Abstract
    // skip Volume Copyright Notice

    // Application Identifier
    m_buffer[344] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 345, m_appId.c_str());

    writeTimestamp(m_buffer + 376, m_currentTime);  // timestamp

    // Implementation Identifier
    m_buffer[388] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 389, m_impId.c_str());

    strcpy(reinterpret_cast<char *>(m_buffer) + 420, m_appId.c_str());

    // skip Predecessor Volume Descriptor Sequence Location (BP 484) = 0L
    m_buffer[488] = 1;  // Flags (BP 488)

    // 490..511 Reserved

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}